

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

page_collection *
page_collection_lock_arm(uc_struct_conflict1 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  byte bVar1;
  ulong uVar2;
  page_collection *set;
  GTree *pGVar3;
  PageDesc *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong index;
  
  set = (page_collection *)g_malloc(0x10);
  bVar1 = (byte)uc->init_target_page->bits;
  index = start >> (bVar1 & 0x3f);
  uVar5 = end >> (bVar1 & 0x3f);
  if (index <= uVar5) {
    pGVar3 = g_tree_new_full(tb_page_addr_cmp,(gpointer)0x0,(GDestroyNotify)0x0,page_entry_destroy);
    set->tree = pGVar3;
    set->max = (page_entry *)0x0;
    for (; index <= uVar5; index = index + 1) {
      pPVar4 = page_find(uc,index);
      if (pPVar4 != (PageDesc *)0x0) {
        page_trylock_add(uc,set,index << ((byte)uc->init_target_page->bits & 0x3f));
        while( true ) {
          uVar2 = pPVar4->first_tb;
          uVar6 = uVar2 & 0xfffffffffffffffe;
          if (uVar6 == 0) break;
          page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar6 + 0x40));
          if (*(tb_page_addr_t *)(uVar6 + 0x48) != 0xffffffffffffffff) {
            page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar6 + 0x48));
          }
          pPVar4 = (PageDesc *)((ulong)((uint)uVar2 & 1) * 8 + 0x30 + uVar6);
        }
      }
    }
    return set;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,0x293,"start <= end");
}

Assistant:

struct page_collection *
page_collection_lock(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *set = g_malloc(sizeof(*set));
    tb_page_addr_t index;
    PageDesc *pd;

    start >>= TARGET_PAGE_BITS;
    end   >>= TARGET_PAGE_BITS;
    g_assert(start <= end);

    set->tree = g_tree_new_full(tb_page_addr_cmp, NULL, NULL,
                                page_entry_destroy);
    set->max = NULL;
    assert_no_pages_locked();

 retry:
#if 0
    g_tree_foreach(set->tree, page_entry_lock, NULL);
#endif

    for (index = start; index <= end; index++) {
        TranslationBlock *tb;
        int n;

        pd = page_find(uc, index);
        if (pd == NULL) {
            continue;
        }
        if (page_trylock_add(uc, set, index << TARGET_PAGE_BITS)) {
#if 0
            g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
            goto retry;
        }
        assert_page_locked(pd);
        PAGE_FOR_EACH_TB(pd, tb, n) {
            if (page_trylock_add(uc, set, tb->page_addr[0]) ||
                (tb->page_addr[1] != -1 &&
                 page_trylock_add(uc, set, tb->page_addr[1]))) {
                /* drop all locks, and reacquire in order */
#if 0
                g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
                goto retry;
            }
        }
    }
    return set;
}